

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O3

Aig_Obj_t * Aig_Miter(Aig_Man_t *p,Vec_Ptr_t *vPairs)

{
  Aig_Obj_t *pAVar1;
  int nObjs;
  long lVar2;
  
  if (vPairs->nSize < 1) {
    __assert_fail("vPairs->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigOper.c"
                  ,0x1b2,"Aig_Obj_t *Aig_Miter(Aig_Man_t *, Vec_Ptr_t *)");
  }
  if ((vPairs->nSize & 1U) == 0) {
    lVar2 = 0;
    do {
      pAVar1 = Aig_Exor(p,(Aig_Obj_t *)vPairs->pArray[lVar2],(Aig_Obj_t *)vPairs->pArray[lVar2 + 1])
      ;
      *(ulong *)((long)vPairs->pArray + lVar2 * 4) = (ulong)pAVar1 ^ 1;
      lVar2 = lVar2 + 2;
    } while ((int)lVar2 < vPairs->nSize);
    nObjs = vPairs->nSize / 2;
    vPairs->nSize = nObjs;
    pAVar1 = Aig_Multi_rec(p,(Aig_Obj_t **)vPairs->pArray,nObjs,AIG_OBJ_AND);
    return (Aig_Obj_t *)((ulong)pAVar1 ^ 1);
  }
  __assert_fail("vPairs->nSize % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigOper.c"
                ,0x1b3,"Aig_Obj_t *Aig_Miter(Aig_Man_t *, Vec_Ptr_t *)");
}

Assistant:

Aig_Obj_t * Aig_Miter( Aig_Man_t * p, Vec_Ptr_t * vPairs )
{
    int i;
    assert( vPairs->nSize > 0 );
    assert( vPairs->nSize % 2 == 0 );
    for ( i = 0; i < vPairs->nSize; i += 2 )
        vPairs->pArray[i/2] = Aig_Not( Aig_Exor( p, (Aig_Obj_t *)vPairs->pArray[i], (Aig_Obj_t *)vPairs->pArray[i+1] ) );
    vPairs->nSize = vPairs->nSize/2;
    return Aig_Not( Aig_Multi_rec( p, (Aig_Obj_t **)vPairs->pArray, vPairs->nSize, AIG_OBJ_AND ) );
}